

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

char * kern::level_to_str(LogLevel *level)

{
  LogLevel LVar1;
  
  LVar1 = *level;
  switch(LVar1) {
  case Trace:
    return "trace";
  case Debug:
    return "debug";
  case Debug|Trace:
  case Info|Trace:
  case Info|Debug:
  case Info|Debug|Trace:
    goto switchD_0010646f_caseD_3;
  case Info:
    return "info";
  case Warning:
    return "warning";
  default:
    if (LVar1 == Error) {
      return "error";
    }
    if (LVar1 == Fatal) {
      return "fatal";
    }
switchD_0010646f_caseD_3:
    return "N/A";
  }
}

Assistant:

const char *level_to_str(const LogLevel &level) noexcept {
        switch(level) {
            case LogLevel::Trace:
                return "trace";
            case LogLevel::Debug:
                return "debug";
            case LogLevel::Info:
                return "info";
            case LogLevel::Warning:
                return "warning";
            case LogLevel::Error:
                return "error";
            case LogLevel::Fatal:
                return "fatal";
            default:
                return "N/A";
        }
    }